

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
cnn::Concatenate::dim_forward
          (Dim *__return_storage_ptr__,Concatenate *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  invalid_argument *this_00;
  ulong uVar7;
  uint uVar8;
  pointer pDVar9;
  uint uVar10;
  bool bVar11;
  Dim c;
  Dim r_1;
  Dim r;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  uint local_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined4 local_1b8;
  uint local_1a8;
  undefined8 local_1a4;
  undefined8 uStack_19c;
  undefined8 local_194;
  uint local_18c;
  undefined4 local_188;
  
  pDVar9 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = *(undefined8 *)(pDVar9->d + 2);
  uVar3 = *(undefined8 *)(pDVar9->d + 4);
  uVar4 = *(undefined8 *)(pDVar9->d + 6);
  *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar9->d;
  *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar2;
  *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar3;
  *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar4;
  __return_storage_ptr__->bd = pDVar9->bd;
  if (1 < (ulong)__return_storage_ptr__->nd) {
    uVar7 = 1;
    do {
      if (__return_storage_ptr__->d[uVar7] != 1) goto LAB_0026f0af;
      uVar7 = uVar7 + 1;
    } while (__return_storage_ptr__->nd != uVar7);
  }
  __return_storage_ptr__->nd = 1;
LAB_0026f0af:
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pDVar9 != pDVar1) {
    uVar10 = __return_storage_ptr__->bd;
    uVar8 = 0;
    do {
      local_208 = *(undefined8 *)pDVar9->d;
      uStack_200 = *(undefined8 *)(pDVar9->d + 2);
      uStack_1f8 = *(undefined8 *)(pDVar9->d + 4);
      uStack_1f0 = *(ulong *)(pDVar9->d + 6);
      local_1e8 = pDVar9->bd;
      if (1 < uStack_1f0 >> 0x20) {
        uVar7 = 1;
        do {
          if (*(int *)((long)&local_208 + uVar7 * 4) != 1) goto LAB_0026f10b;
          uVar7 = uVar7 + 1;
        } while (uStack_1f0 >> 0x20 != uVar7);
      }
      uStack_1f0 = CONCAT44(1,(undefined4)uStack_1f0);
LAB_0026f10b:
      uVar5 = (uint)local_208;
      if ((uint)local_208 == 0) {
        __return_storage_ptr__->bd = uVar10;
        goto LAB_0026f23e;
      }
      local_1a4 = *(undefined8 *)(__return_storage_ptr__->d + 1);
      uStack_19c = *(undefined8 *)(__return_storage_ptr__->d + 3);
      __return_storage_ptr__->d[0] = (uint)local_208;
      local_194 = *(undefined8 *)(__return_storage_ptr__->d + 5);
      local_18c = __return_storage_ptr__->nd;
      local_1a8 = __return_storage_ptr__->d[0];
      local_188 = 1;
      uStack_1c0 = uStack_1f0;
      uVar7 = uStack_1c0;
      local_1b8 = 1;
      uStack_1c0._4_4_ = (uint)(uStack_1f0 >> 0x20);
      bVar11 = local_18c != uStack_1c0._4_4_;
      local_1d8 = local_208;
      uStack_1d0 = uStack_200;
      uStack_1c8 = uStack_1f8;
      uStack_1c0 = uVar7;
      if (bVar11) {
LAB_0026f1c0:
        __return_storage_ptr__->bd = uVar10;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Bad input dimensions in Concatenate: ",0x25);
        operator<<((ostream *)&local_1a8,xs);
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(this_00,(string *)&local_1d8);
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      iVar6 = bcmp(&local_1a8,&local_1d8,(ulong)local_18c);
      if (iVar6 != 0) goto LAB_0026f1c0;
      uVar8 = uVar8 + uVar5;
      if (uVar10 <= local_1e8) {
        uVar10 = local_1e8;
      }
      pDVar9 = pDVar9 + 1;
    } while (pDVar9 != pDVar1);
    __return_storage_ptr__->bd = uVar10;
    if (uVar8 != 0) {
      __return_storage_ptr__->d[0] = uVar8;
      return __return_storage_ptr__;
    }
  }
LAB_0026f23e:
  __assert_fail("s > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/dim.h"
                ,0x44,"void cnn::Dim::set(unsigned int, unsigned int)");
}

Assistant:

Dim Concatenate::dim_forward(const vector<Dim>& xs) const {
  unsigned new_rows = 0;
  Dim dr = xs[0];
  if (LooksLikeVector(dr)) dr.resize(1);
  for (auto c : xs) {
    if (LooksLikeVector(c)) c.resize(1);
    new_rows += c[0];
    dr.set(0, c[0]);
    if (dr.single_batch() != c.single_batch()) {
      ostringstream s; s << "Bad input dimensions in Concatenate: " << xs;
      throw std::invalid_argument(s.str());
    }
    dr.bd = max(dr.bd, c.bd);
  }
  dr.set(0, new_rows);
  return dr;
}